

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,Cord *value)

{
  ReflectionSchema *this_00;
  byte bVar1;
  Descriptor *pDVar2;
  CordRep *pCVar3;
  bool bVar4;
  CppStringType CVar5;
  uint32_t has_bit_index;
  uint32_t uVar6;
  uint32_t uVar7;
  string *dst;
  OneofDescriptor *pOVar8;
  ArenaStringPtr *pAVar9;
  Cord *pCVar10;
  Cord **ppCVar11;
  Nonnull<const_char_*> failure_msg;
  char *description;
  Arena *extraout_RDX;
  Arena *pAVar12;
  uint32_t unaff_EBP;
  Metadata MVar13;
  uint local_70;
  uint32_t local_6c;
  string local_68;
  InlinedStringField *local_48;
  LogMessageFatal local_40;
  
  MVar13 = Message::GetMetadata(message);
  if (MVar13.reflection != this) {
    pDVar2 = this->descriptor_;
    MVar13 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar2,MVar13.descriptor,field,"SetString");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ != pDVar2) {
    description = "Field does not match message type.";
LAB_00419fde:
    anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"SetString",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    SetString();
LAB_00419f06:
    SetString();
    pAVar12 = extraout_RDX;
LAB_00419f10:
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
LAB_00419de3:
    internal::ArenaStringPtr::Set((ArenaStringPtr *)field,&local_68,pAVar12);
    goto LAB_00419df0;
  }
  if ((bVar1 & 0x20) != 0) {
    description = "Field is repeated; the method requires a singular field.";
    goto LAB_00419fde;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
    anon_unknown_6::ReportReflectionUsageTypeError(pDVar2,field,"SetString",CPPTYPE_STRING);
  }
  if ((bVar1 & 8) != 0) {
    uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    dst = internal::ExtensionSet::MutableString_abi_cxx11_
                    ((ExtensionSet *)
                     ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),
                     field->number_,field->type_,field);
    absl::lts_20250127::CopyCordToString(value,dst);
    return;
  }
  CVar5 = FieldDescriptor::cpp_string_type(field);
  if ((CVar5 != kView) && (CVar5 != kString)) {
    if (CVar5 != kCord) {
      return;
    }
    bVar4 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if (bVar4) {
      if ((field->field_0x1 & 0x10) == 0) {
        pOVar8 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar8 = (field->scope_).containing_oneof;
        if (pOVar8 == (OneofDescriptor *)0x0) goto LAB_00419ffa;
      }
      uVar7 = GetOneofCase(this,message,pOVar8);
      if (uVar7 != field->number_) {
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar8 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar8 = (field->scope_).containing_oneof;
          if (pOVar8 == (OneofDescriptor *)0x0) {
LAB_00419ffa:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
        }
        ClearOneof(this,message,pOVar8);
        pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
        if (((ulong)pAVar12 & 1) != 0) {
          pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
        }
        if (pAVar12 == (Arena *)0x0) {
          pCVar10 = (Cord *)operator_new(0x10);
        }
        else {
          pCVar10 = (Cord *)Arena::AllocateAlignedWithCleanup
                                      (pAVar12,0x10,8,
                                       internal::cleanup::
                                       arena_destruct_object<absl::lts_20250127::Cord>);
        }
        (pCVar10->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
        (pCVar10->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
        ppCVar11 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
        *ppCVar11 = pCVar10;
      }
      ppCVar11 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
      pCVar10 = *ppCVar11;
      if (pCVar10 == value) {
        return;
      }
      if ((((pCVar10->contents_).data_.rep_.field_0.data[0] & 1U) == 0) &&
         (((value->contents_).data_.rep_.field_0.data[0] & 1U) == 0)) {
        pCVar3 = (value->contents_).data_.rep_.field_0.as_tree.rep;
        (pCVar10->contents_).data_.rep_.field_0.as_tree.cordz_info =
             (value->contents_).data_.rep_.field_0.as_tree.cordz_info;
        (pCVar10->contents_).data_.rep_.field_0.as_tree.rep = pCVar3;
        return;
      }
    }
    else {
      pCVar10 = MutableField<absl::lts_20250127::Cord>(this,message,field);
      if (pCVar10 == value) {
        return;
      }
      if ((((pCVar10->contents_).data_.rep_.field_0.data[0] & 1U) == 0) &&
         (((value->contents_).data_.rep_.field_0.data[0] & 1U) == 0)) {
        pCVar3 = (value->contents_).data_.rep_.field_0.as_tree.rep;
        (pCVar10->contents_).data_.rep_.field_0.as_tree.cordz_info =
             (value->contents_).data_.rep_.field_0.as_tree.cordz_info;
        (pCVar10->contents_).data_.rep_.field_0.as_tree.rep = pCVar3;
        return;
      }
    }
    absl::lts_20250127::Cord::InlineRep::AssignSlow(&pCVar10->contents_,&value->contents_);
    return;
  }
  this_00 = &this->schema_;
  bVar4 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
  if (!bVar4) {
    bVar4 = internal::ReflectionSchema::InRealOneof(this_00,field);
    if (bVar4) {
      if ((field->field_0x1 & 0x10) == 0) {
        pOVar8 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar8 = (field->scope_).containing_oneof;
        if (pOVar8 == (OneofDescriptor *)0x0) goto LAB_00419ffa;
      }
      uVar7 = GetOneofCase(this,message,pOVar8);
      if (uVar7 != field->number_) {
        pOVar8 = FieldDescriptor::containing_oneof(field);
        ClearOneof(this,message,pOVar8);
        pAVar9 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        (pAVar9->tagged_ptr_).ptr_ = &internal::fixed_address_empty_string;
      }
    }
    field = (FieldDescriptor *)
            MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    absl::lts_20250127::Cord::operator_cast_to_string(&local_68,value);
    pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar12 & 1) != 0) goto LAB_00419f10;
    goto LAB_00419de3;
  }
  local_48 = MutableField<google::protobuf::internal::InlinedStringField>(this,message,field);
  uVar7 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
  if (uVar7 == 0) goto LAB_00419f06;
  if ((this->schema_).inlined_string_donated_offset_ == -1) {
    SetString();
    uVar7 = unaff_EBP;
LAB_00419f26:
    value = *(Cord **)((ulong)value & 0xfffffffffffffffe);
  }
  else {
    local_70 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    bVar1 = (byte)uVar7 & 0x1f;
    local_6c = -2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1;
    absl::lts_20250127::Cord::operator_cast_to_string(&local_68,value);
    value = (Cord *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)value & 1) != 0) goto LAB_00419f26;
  }
  has_bit_index = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
  if (has_bit_index == 0) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,0,"index > 0u");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xbc3,failure_msg);
  }
  else {
    if ((this->schema_).inlined_string_donated_offset_ != -1) {
      uVar6 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
      bVar4 = anon_unknown_6::IsIndexInHasBitSet
                        ((uint32_t *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
                         has_bit_index);
      internal::InlinedStringField::Set
                (local_48,&local_68,(Arena *)value,bVar4,
                 (uint32_t *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite +
                 (ulong)(uVar7 >> 5) * 4 + (ulong)local_70),local_6c,&message->super_MessageLite);
LAB_00419df0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xbb4,"schema_.HasInlinedString()");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           const absl::Cord& value) const {
  USAGE_MUTABLE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return absl::CopyCordToString(value,
                                  MutableExtensionSet(message)->MutableString(
                                      field->number(), field->type(), field));
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          if (!HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            *MutableField<absl::Cord*>(message, field) =
                Arena::Create<absl::Cord>(message->GetArena());
          }
          *(*MutableField<absl::Cord*>(message, field)) = value;
        } else {
          *MutableField<absl::Cord>(message, field) = value;
        }
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString: {
        if (IsInlined(field)) {
          auto* str = MutableField<InlinedStringField>(message, field);
          const uint32_t index = schema_.InlinedStringIndex(field);
          ABSL_DCHECK_GT(index, 0u);
          uint32_t* states =
              &MutableInlinedStringDonatedArray(message)[index / 32];
          uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
          str->Set(std::string(value), message->GetArena(),
                   IsInlinedStringDonated(*message, field), states, mask,
                   message);
        } else if (IsMicroString(field)) {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<MicroString>(message, field)->InitDefault();
          }
          auto* str = MutableField<MicroString>(message, field);
          str->Set(std::string(value), message->GetArena());
        } else {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<ArenaStringPtr>(message, field)->InitDefault();
          }
          auto* str = MutableField<ArenaStringPtr>(message, field);
          str->Set(std::string(value), message->GetArena());
        }
        break;
      }
    }
  }
}